

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::NegativeAPIBind::Run(NegativeAPIBind *this)

{
  GLenum GVar1;
  int local_20;
  GLuint local_1c;
  GLint alignment;
  GLint bindings;
  NegativeAPIBind *this_local;
  
  _alignment = this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90dd,(GLint *)&local_1c);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90df,&local_20);
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90d2,local_1c,0);
  GVar1 = glu::CallLogWrapper::glGetError
                    (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper);
  if (GVar1 == 0x501) {
    glu::CallLogWrapper::glBindBufferRange
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,local_1c,0,0,0);
    GVar1 = glu::CallLogWrapper::glGetError
                      (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                        super_GLWrapper.super_CallLogWrapper);
    if (GVar1 == 0x501) {
      glu::CallLogWrapper::glBindBufferRange
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,0,(long)(local_20 + -1),0);
      GVar1 = glu::CallLogWrapper::glGetError
                        (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                          super_GLWrapper.super_CallLogWrapper);
      if (GVar1 == 0x501) {
        this_local = (NegativeAPIBind *)0x0;
      }
      else {
        anon_unknown_0::Output
                  (
                  "INVALID_VALUE is generated by BindBufferRange if <target> is\nSHADER_STORAGE_BUFFER and <offset> is not a multiple of the value of\nSHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT.\n"
                  );
        this_local = (NegativeAPIBind *)&DAT_ffffffffffffffff;
      }
    }
    else {
      anon_unknown_0::Output
                (
                "INVALID_VALUE is generated by BindBufferRange if <target> is\nSHADER_STORAGE_BUFFER and <index> is greater than or equal to the value of\nMAX_SHADER_STORAGE_BUFFER_BINDINGS.\n"
                );
      this_local = (NegativeAPIBind *)&DAT_ffffffffffffffff;
    }
  }
  else {
    anon_unknown_0::Output
              (
              "INVALID_VALUE is generated by BindBufferBase if <target> is\nSHADER_STORAGE_BUFFER and <index> is greater than or equal to the value of\nMAX_SHADER_STORAGE_BUFFER_BINDINGS.\n"
              );
    this_local = (NegativeAPIBind *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		GLint bindings;
		GLint alignment;
		glGetIntegerv(GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS, &bindings);
		glGetIntegerv(GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT, &alignment);

		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, bindings, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE is generated by BindBufferBase if <target> is\n"
				   "SHADER_STORAGE_BUFFER and <index> is greater than or equal to the value of\n"
				   "MAX_SHADER_STORAGE_BUFFER_BINDINGS.\n");
			return ERROR;
		}

		glBindBufferRange(GL_SHADER_STORAGE_BUFFER, bindings, 0, 0, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE is generated by BindBufferRange if <target> is\n"
				   "SHADER_STORAGE_BUFFER and <index> is greater than or equal to the value of\n"
				   "MAX_SHADER_STORAGE_BUFFER_BINDINGS.\n");
			return ERROR;
		}

		glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 0, alignment - 1, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE is generated by BindBufferRange if <target> is\n"
				   "SHADER_STORAGE_BUFFER and <offset> is not a multiple of the value of\n"
				   "SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT.\n");
			return ERROR;
		}

		return NO_ERROR;
	}